

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall
capnp::DynamicStruct::Builder::Builder(Builder *this,StructSchema schema,OrphanBuilder *orphan)

{
  uint uVar1;
  uint uVar2;
  Schema local_50;
  Reader local_48;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  local_50 = schema.super_Schema.raw;
  Schema::getProto(&local_48,&local_50);
  uVar2 = 0;
  uVar1 = 0;
  if (0x7f < local_48._reader.dataSize) {
    uVar1 = (uint)*(ushort *)((long)local_48._reader.data + 0xe);
  }
  if (0xcf < local_48._reader.dataSize) {
    uVar2 = (uint)*(ushort *)((long)local_48._reader.data + 0x18) << 0x10;
  }
  capnp::_::OrphanBuilder::asStruct(&this->builder,orphan,(StructSize)(uVar2 | uVar1));
  return;
}

Assistant:

DynamicStruct::Builder::Builder(StructSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(orphan.asStruct(structSizeFromSchema(schema))) {}